

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::Equal(VirtualMachine *this)

{
  bool val;
  Variable VVar1;
  Variable VVar2;
  Variable var1;
  Variable first;
  Variable second;
  VirtualMachine *this_local;
  
  VVar1 = popOpStack(this);
  VVar2 = popOpStack(this);
  var1.field_1 = VVar2.field_1;
  var1._4_4_ = 0;
  var1.type = VVar2.type;
  VVar2._4_4_ = 0;
  VVar2.type = VVar1.type;
  VVar2.field_1.integerValue = VVar1.field_1.integerValue;
  val = variableEquals(this,var1,VVar2);
  pushBoolean(this,val);
  advance(this);
  return;
}

Assistant:

void runtime::VirtualMachine::Equal() {
  Variable second = this->popOpStack();
  Variable first = this->popOpStack();

  this->pushBoolean(this->variableEquals(first, second));
  this->advance();
}